

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  char cVar1;
  u32 uVar2;
  char *pcVar3;
  double in_RAX;
  long lVar4;
  size_t sVar5;
  u8 *z;
  uint uVar6;
  uint uVar7;
  long val;
  int iVar8;
  Mem *pMVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  code *xDel;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  double r;
  double local_38;
  
  local_38 = in_RAX;
  switch(pNode->eType) {
  case '\x01':
    pMVar9 = pCtx->pOut;
    if ((pMVar9->flags & 0x2400) != 0) {
      val = 1;
LAB_001d0353:
      vdbeReleaseAndSetInt64(pMVar9,val);
      return;
    }
    (pMVar9->u).r = 4.94065645841247e-324;
    break;
  case '\x02':
    pMVar9 = pCtx->pOut;
    if ((pMVar9->flags & 0x2400) != 0) {
      val = 0;
      goto LAB_001d0353;
    }
    (pMVar9->u).r = 0.0;
    break;
  case '\x03':
    lVar4 = 0;
    pcVar3 = (pNode->u).zJContent + (*(pNode->u).zJContent == '-');
    do {
      cVar1 = *pcVar3;
      if (9 < (byte)(cVar1 - 0x30U)) {
        val = -lVar4;
        if (*(pNode->u).zJContent != '-') {
          val = lVar4;
        }
        pMVar9 = pCtx->pOut;
        if ((pMVar9->flags & 0x2400) != 0) goto LAB_001d0353;
        (pMVar9->u).i = val;
        goto LAB_001d037f;
      }
      if (lVar4 < 0xccccccccccccccc) {
LAB_001d009e:
        lVar4 = (ulong)(byte)(cVar1 - 0x30) + lVar4 * 10;
        iVar8 = 0;
        bVar16 = true;
      }
      else {
        iVar11 = 5;
        iVar8 = 5;
        if (lVar4 == 0xccccccccccccccc) {
          iVar8 = iVar11;
          if ((9 < (byte)(pcVar3[1] - 0x30U)) && (cVar1 != '9')) {
            if (cVar1 != '8') goto LAB_001d009e;
            if (*(pNode->u).zJContent == '-') {
              pMVar9 = pCtx->pOut;
              if ((pMVar9->flags & 0x2400) == 0) {
                (pMVar9->u).r = -0.0;
                pMVar9->flags = 4;
              }
              else {
                vdbeReleaseAndSetInt64(pMVar9,-0x8000000000000000);
              }
              iVar8 = 6;
            }
          }
          bVar16 = false;
          lVar4 = 0xccccccccccccccc;
        }
        else {
          bVar16 = false;
        }
      }
      pcVar3 = pcVar3 + 1;
    } while (iVar8 == 0);
    if (iVar8 != 5) {
      if (iVar8 == 6) {
        return;
      }
      if (!bVar16) {
        return;
      }
    }
  case '\x04':
    pcVar3 = (pNode->u).zJContent;
    if (pcVar3 == (char *)0x0) {
      uVar6 = 0;
    }
    else {
      sVar5 = strlen(pcVar3);
      uVar6 = (uint)sVar5 & 0x3fffffff;
    }
    sqlite3AtoF(pcVar3,&local_38,uVar6,'\x01');
    sqlite3VdbeMemSetDouble(pCtx->pOut,local_38);
    return;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      z = &((pNode->u).pPatch)->jnFlags;
      uVar6 = pNode->n - 2;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    else {
      uVar2 = pNode->n;
      pcVar3 = (pNode->u).zJContent;
      z = (u8 *)sqlite3_malloc(uVar2 + 1);
      if (z == (u8 *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
      uVar15 = uVar2 - 1;
      uVar6 = 0;
      if (1 < uVar15) {
        uVar14 = 1;
        uVar6 = 0;
        do {
          uVar13 = (uint)uVar14;
          bVar10 = pcVar3[uVar14];
          bVar16 = true;
          if (bVar10 == 0x5c) {
            uVar7 = uVar13 + 1;
            bVar10 = pcVar3[uVar7];
            if (bVar10 < 0x6e) {
              uVar12 = 8;
              if (bVar10 != 0x62) {
                if (bVar10 != 0x66) {
LAB_001d02a4:
                  if (bVar10 == 0x74) {
                    bVar10 = 9;
                  }
                  iVar8 = 1;
                  uVar14 = (ulong)uVar6;
                  goto LAB_001d0285;
                }
                uVar12 = 0xc;
              }
LAB_001d027c:
              bVar10 = (byte)uVar12;
              iVar8 = 1;
              uVar14 = (ulong)uVar6;
              goto LAB_001d0285;
            }
            if (bVar10 == 0x6e) {
              uVar12 = 10;
              goto LAB_001d027c;
            }
            if (bVar10 == 0x72) {
              uVar12 = 0xd;
              goto LAB_001d027c;
            }
            if (bVar10 != 0x75) goto LAB_001d02a4;
            uVar7 = uVar13 + 5;
            iVar8 = 0;
            uVar12 = 0;
            do {
              cVar1 = pcVar3[uVar13 + 2 + iVar8];
              iVar11 = uVar12 * 0x10;
              if (cVar1 < 0x3a) {
                iVar11 = iVar11 + -0x30;
              }
              else if (cVar1 < 'G') {
                iVar11 = iVar11 + -0x37;
              }
              else {
                iVar11 = iVar11 + -0x57;
              }
              uVar12 = iVar11 + cVar1;
              iVar8 = iVar8 + 1;
            } while (iVar8 != 4);
            bVar16 = uVar12 != 0;
            if (bVar16) {
              if (0x7f < uVar12) {
                uVar14 = (ulong)(uVar6 + 1);
                if (uVar12 < 0x800) {
                  z[uVar6] = (byte)(uVar12 >> 6) | 0xc0;
                  bVar10 = (byte)uVar12 & 0x3f | 0x80;
                  iVar8 = 2;
                }
                else {
                  z[uVar6] = (byte)(uVar12 >> 0xc) | 0xe0;
                  z[uVar6 + 1] = (byte)(uVar12 >> 6) & 0x3f | 0x80;
                  bVar10 = (byte)uVar12 & 0x3f | 0x80;
                  iVar8 = 3;
                  uVar14 = (ulong)(uVar6 + 2);
                }
                goto LAB_001d0285;
              }
              goto LAB_001d027c;
            }
          }
          else {
            iVar8 = 1;
            uVar14 = (ulong)uVar6;
            uVar7 = uVar13;
LAB_001d0285:
            uVar6 = uVar6 + iVar8;
            z[uVar14] = bVar10;
          }
        } while ((bVar16) && (uVar14 = (ulong)(uVar7 + 1), uVar7 + 1 < uVar15));
      }
      z[uVar6] = '\0';
      xDel = sqlite3_free;
    }
    setResultStrOrError(pCtx,(char *)z,uVar6,'\x01',xDel);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,(sqlite3_value **)0x0);
    return;
  default:
    pMVar9 = pCtx->pOut;
    if ((pMVar9->flags & 0x2400) == 0) {
      pMVar9->flags = 1;
      return;
    }
    vdbeMemClearExternAndSetNull(pMVar9);
    return;
  }
LAB_001d037f:
  pMVar9->flags = 4;
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: /* fall through to real */;
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else 
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z = pNode->u.zJContent;
        char *zOut;
        u32 j;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = 0, k;
              for(k=0; k<4; i++, k++){
                assert( i<n-2 );
                c = z[i+1];
                assert( safe_isxdigit(c) );
                if( c<='9' ) v = v*16 + c - '0';
                else if( c<='F' ) v = v*16 + c - 'A' + 10;
                else v = v*16 + c - 'a' + 10;
              }
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                zOut[j++] = (char)(0xe0 | (v>>12));
                zOut[j++] = 0x80 | ((v>>6)&0x3f);
                zOut[j++] = 0x80 | (v&0x3f);
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}